

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BlockSymbols.cpp
# Opt level: O3

GenerateBlockSymbol *
slang::ast::GenerateBlockSymbol::fromSyntax
          (Scope *scope,GenerateBlockSyntax *syntax,uint32_t constructIndex)

{
  span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL> *psVar1;
  size_type sVar2;
  pointer ppMVar3;
  span<const_slang::syntax::AttributeInstanceSyntax_*const,_18446744073709551615UL> syntax_00;
  GenerateBlockSymbol *this;
  long lVar4;
  SourceLocation loc;
  string_view name;
  uint32_t local_54;
  Token local_50;
  SourceLocation local_40;
  string_view local_38;
  
  local_54 = constructIndex;
  local_38 = getGenerateBlockName((SyntaxNode *)syntax);
  local_50 = slang::syntax::SyntaxNode::getFirstToken((SyntaxNode *)syntax);
  local_40 = parsing::Token::location(&local_50);
  local_50.kind._0_1_ = 1;
  this = BumpAllocator::
         emplace<slang::ast::GenerateBlockSymbol,slang::ast::Compilation&,std::basic_string_view<char,std::char_traits<char>>&,slang::SourceLocation&,unsigned_int&,bool>
                   (&scope->compilation->super_BumpAllocator,scope->compilation,&local_38,&local_40,
                    &local_54,(bool *)&local_50);
  (this->super_Symbol).originatingSyntax = (SyntaxNode *)syntax;
  psVar1 = &(syntax->super_MemberSyntax).attributes.
            super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>;
  syntax_00.data_ = psVar1->data_;
  syntax_00.size_ = psVar1->size_;
  if ((syntax->super_MemberSyntax).attributes.
      super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>.size_ == 0 ||
      psVar1->data_ != (pointer)0x0) {
    Symbol::setAttributes(&this->super_Symbol,scope,syntax_00);
    sVar2 = (syntax->members).super_span<slang::syntax::MemberSyntax_*,_18446744073709551615UL>.
            size_;
    if (sVar2 != 0) {
      ppMVar3 = (syntax->members).super_span<slang::syntax::MemberSyntax_*,_18446744073709551615UL>.
                data_;
      lVar4 = 0;
      do {
        Scope::addMembers(&this->super_Scope,*(SyntaxNode **)((long)ppMVar3 + lVar4));
        lVar4 = lVar4 + 8;
      } while (sVar2 << 3 != lVar4);
    }
    return this;
  }
  std::terminate();
}

Assistant:

GenerateBlockSymbol& GenerateBlockSymbol::fromSyntax(const Scope& scope,
                                                     const GenerateBlockSyntax& syntax,
                                                     uint32_t constructIndex) {
    // This overload is only called for the illegal case of a generate block
    // without a condition attached.
    string_view name = getGenerateBlockName(syntax);
    SourceLocation loc = syntax.getFirstToken().location();

    auto& comp = scope.getCompilation();
    auto block = comp.emplace<GenerateBlockSymbol>(comp, name, loc, constructIndex,
                                                   /* isInstantiated */ true);
    block->setSyntax(syntax);
    block->setAttributes(scope, syntax.attributes);

    for (auto member : syntax.members)
        block->addMembers(*member);

    return *block;
}